

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfManager::~TFProfManager(TFProfManager *this)

{
  pointer pcVar1;
  size_type sVar2;
  pointer psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  ulong uVar6;
  ProfileData data;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> serializer;
  ofstream ofs;
  vector<tf::Timeline,_std::allocator<tf::Timeline>_> local_248;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> local_230;
  long local_228;
  filebuf local_220 [24];
  byte abStack_208 [216];
  ios_base local_130 [264];
  
  std::ofstream::ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)&local_228,(string *)this,_S_out);
  if ((abStack_208[*(long *)(local_228 + -0x18)] & 5) == 0) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (&this->_fpath,".tfp",0xffffffffffffffff,4);
    if (sVar2 == 0xffffffffffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"[\n",2);
      if ((this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          if (uVar6 != 0) {
            local_248.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_248.
                                   super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,0x2c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_228,(char *)&local_248,1);
          }
          TFProfObserver::dump
                    (*(TFProfObserver **)
                      ((long)&(((this->_observers).
                                super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar5),(ostream *)&local_228);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x10;
        } while (uVar6 < (ulong)((long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"]\n",2);
    }
    else {
      local_248.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::reserve
                (&local_248,
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_observers).
                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      psVar3 = (this->_observers).
               super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_observers).
          super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::emplace_back<tf::Timeline>
                    (&local_248,
                     (Timeline *)
                     (*(long *)((long)&(psVar3->
                                       super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar5) + 8));
          uVar6 = uVar6 + 1;
          psVar3 = (this->_observers).
                   super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x10;
        } while (uVar6 < (ulong)((long)(this->_observers).
                                       super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >>
                                4));
      }
      local_230._stream = (basic_ofstream<char,_std::char_traits<char>_> *)&local_228;
      Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
      _save<const_std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>_&,_nullptr>
                (&local_230,&local_248);
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::~vector(&local_248);
    }
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::~vector(&this->_observers);
  pcVar1 = (this->_fpath)._M_dataplus._M_p;
  paVar4 = &(this->_fpath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline TFProfManager::~TFProfManager() {
  std::ofstream ofs(_fpath);
  if(ofs) {
    // .tfp
    if(_fpath.rfind(".tfp") != std::string::npos) {
      ProfileData data;
      data.timelines.reserve(_observers.size());
      for(size_t i=0; i<_observers.size(); ++i) {
        data.timelines.push_back(std::move(_observers[i]->_timeline));
      }
      Serializer<std::ofstream> serializer(ofs);
      serializer(data);
    }
    // .json
    else {
      ofs << "[\n";
      for(size_t i=0; i<_observers.size(); ++i) {
        if(i) ofs << ',';
        _observers[i]->dump(ofs);
      }
      ofs << "]\n";
    }
  }
}